

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tga.cpp
# Opt level: O3

Image * rw::readTGA(char *filename)

{
  uint8 uVar1;
  int iVar2;
  Image *this;
  uint uVar3;
  size_t __nbytes;
  void *__buf;
  uint uVar4;
  int iVar5;
  uint8 *puVar6;
  uint8 *puVar7;
  int iVar8;
  ulong uVar9;
  TGAHeader header;
  uint32 length;
  TGAHeader local_74;
  uint8 *local_60;
  uint32 local_54;
  StreamMemory local_50;
  
  local_60 = getFileContents(filename,&local_54);
  local_50.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00149c70;
  __nbytes = 0;
  StreamMemory::open(&local_50,(char *)local_60,local_54);
  TGAHeader::read(&local_74,(int)&local_50,__buf,__nbytes);
  StreamMemory::seek(&local_50,(int)local_74.IDlen,1);
  if (local_74.colorMapType == '\0') {
    uVar4 = (uint)local_74.depth;
  }
  else {
    uVar4 = (uint)(0x10 < local_74.colorMapLength) * 4 + 4;
  }
  this = Image::create((int)local_74.width,(int)local_74.height,uVar4);
  Image::allocate(this);
  if ((local_74.colorMapType != '\0') && (puVar6 = this->palette, puVar6 != (uint8 *)0x0)) {
    uVar3 = 0x100;
    if (uVar4 == 4) {
      uVar3 = 0x10;
    }
    uVar4 = (uint)local_74.colorMapLength;
    if (local_74.colorMapLength < 1) {
      uVar4 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar6[uVar9 * 4 + 2] = uVar1;
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar6[uVar9 * 4 + 1] = uVar1;
        uVar1 = Stream::readU8(&local_50.super_Stream);
        puVar6[uVar9 * 4] = uVar1;
        puVar6[uVar9 * 4 + 3] = 0xff;
        if (local_74.colorMapType != '\0' && local_74.colorMapDepth == ' ') {
          uVar1 = Stream::readU8(&local_50.super_Stream);
          puVar6[uVar9 * 4 + 3] = uVar1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
      if (uVar3 <= uVar4) goto LAB_00112709;
    }
    uVar9 = (ulong)uVar4;
    do {
      puVar7 = puVar6 + uVar9 * 4;
      puVar7[0] = '\0';
      puVar7[1] = '\0';
      puVar7[2] = '\0';
      puVar7[3] = 0xff;
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
LAB_00112709:
  puVar6 = this->pixels;
  if ((local_74.descriptor & 0x20) == 0) {
    puVar6 = puVar6 + (long)this->stride * ((long)this->height + -1);
  }
  if (0 < this->height) {
    iVar2 = this->width;
    iVar8 = 0;
    do {
      if (0 < iVar2) {
        iVar5 = 0;
        puVar7 = puVar6;
        do {
          switch(this->depth << 0x1e | this->depth - 4U >> 2) {
          case 3:
            uVar1 = Stream::readU8(&local_50.super_Stream);
            *puVar7 = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[1] = uVar1;
            break;
          case 5:
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[2] = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[1] = uVar1;
          case 0:
          case 1:
            uVar1 = Stream::readU8(&local_50.super_Stream);
            *puVar7 = uVar1;
            break;
          case 7:
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[2] = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[1] = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
            *puVar7 = uVar1;
            uVar1 = Stream::readU8(&local_50.super_Stream);
            puVar7[3] = uVar1;
          }
          puVar7 = puVar7 + this->bpp;
          iVar5 = iVar5 + 1;
          iVar2 = this->width;
        } while (iVar5 < iVar2);
      }
      iVar5 = -this->stride;
      if ((local_74.descriptor & 0x20) != 0) {
        iVar5 = this->stride;
      }
      puVar6 = puVar6 + iVar5;
      iVar8 = iVar8 + 1;
    } while (iVar8 < this->height);
  }
  StreamMemory::close(&local_50,(int)puVar6);
  (*DAT_0014ada0)(local_60);
  return this;
}

Assistant:

Image*
readTGA(const char *filename)
{
	TGAHeader header;
	Image *image;
	int depth = 0, palDepth = 0;
	uint32 length;
	uint8 *data = getFileContents(filename, &length);
	assert(data != nil);
	StreamMemory file;
	file.open(data, length);
	header.read(&file);

	assert(header.imageType == 1 || header.imageType == 2);
	file.seek(header.IDlen);
	if(header.colorMapType){
		assert(header.colorMapOrigin == 0);
		depth = (header.colorMapLength <= 16) ? 4 : 8;
		palDepth = header.colorMapDepth;
		assert(palDepth == 24 || palDepth == 32);
	}else{
		depth = header.depth;
		assert(depth == 16 || depth == 24 || depth == 32);
	}

	image = Image::create(header.width, header.height, depth);
	image->allocate();
	uint8 *palette = header.colorMapType ? image->palette : nil;
	uint8 (*color)[4] = nil;
	if(palette){
		int maxlen = depth == 4 ? 16 : 256;
		color = (uint8(*)[4])palette;
		int i;
		for(i = 0; i < header.colorMapLength; i++){
			color[i][2] = file.readU8();
			color[i][1] = file.readU8();
			color[i][0] = file.readU8();
			color[i][3] = 0xFF;
			if(palDepth == 32)
				color[i][3] = file.readU8();
		}
		for(; i < maxlen; i++){
			color[i][0] = color[i][1] = color[i][2] = 0;
			color[i][3] = 0xFF;
		}
	}

	uint8 *pixels = image->pixels;
	if(!(header.descriptor & 0x20))
		pixels += (image->height-1)*image->stride;
	for(int y = 0; y < image->height; y++){
		uint8 *line = pixels;
		for(int x = 0; x < image->width; x++){
			switch(image->depth){
			case 4:
			case 8:
				line[0] = file.readU8();
				break;
			case 16:
				line[0] = file.readU8();
				line[1] = file.readU8();
				break;
			case 24:
				line[2] = file.readU8();
				line[1] = file.readU8();
				line[0] = file.readU8();
				break;
			case 32:
				line[2] = file.readU8();
				line[1] = file.readU8();
				line[0] = file.readU8();
				line[3] = file.readU8();
				break;
			}
			line += image->bpp;
		}
		pixels += (header.descriptor&0x20) ?
		              image->stride : -image->stride;
	}

	file.close();
	rwFree(data);
	return image;
}